

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::internal::appendLastErrorText(obx_err err,string *outMessage)

{
  char *pcVar1;
  string *psVar2;
  __cxx11 local_70 [48];
  __cxx11 local_40 [36];
  int local_1c;
  string *psStack_18;
  obx_err lastErr;
  string *outMessage_local;
  obx_err err_local;
  
  psStack_18 = outMessage;
  outMessage_local._4_4_ = err;
  local_1c = obx_last_error_code();
  if (outMessage_local._4_4_ == local_1c) {
    if (local_1c == 0) {
      __assert_fail("lastErr != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O0/_deps/objectbox-download-src/include/objectbox.hpp"
                    ,199,"void obx::internal::appendLastErrorText(obx_err, std::string &)");
    }
    pcVar1 = (char *)obx_last_error_message();
    std::__cxx11::string::operator+=((string *)psStack_18,pcVar1);
  }
  else {
    psVar2 = (string *)std::__cxx11::string::append((char *)psStack_18);
    std::__cxx11::to_string(local_40,outMessage_local._4_4_);
    std::__cxx11::string::append(psVar2);
    std::__cxx11::string::~string((string *)local_40);
    if (local_1c != 0) {
      psVar2 = (string *)std::__cxx11::string::append((char *)psStack_18);
      std::__cxx11::to_string(local_70,local_1c);
      std::__cxx11::string::append(psVar2);
      std::__cxx11::string::~string((string *)local_70);
      pcVar1 = (char *)std::__cxx11::string::append((char *)psStack_18);
      obx_last_error_message();
      pcVar1 = (char *)std::__cxx11::string::append(pcVar1);
      std::__cxx11::string::append(pcVar1);
    }
  }
  return;
}

Assistant:

void appendLastErrorText(obx_err err, std::string& outMessage) {
    obx_err lastErr = obx_last_error_code();
    if (err == lastErr) {
        assert(lastErr != 0);  // checked indirectly against err before
        outMessage += obx_last_error_message();
    } else {  // Do not use obx_last_error_message() as primary msg because it originated from another code
        outMessage.append("Error code ").append(std::to_string(err));
        if (lastErr != 0) {
            outMessage.append(" (last: ").append(std::to_string(lastErr));
            outMessage.append(", last msg: ").append(obx_last_error_message()).append(")");
        }
    }
}